

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O0

UnicodeString * __thiscall
booster::locale::impl_icu::icu_std_converter<char,_1>::icu
          (icu_std_converter<char,_1> *this,char_type *vb,char_type *ve)

{
  UConverter *pUVar1;
  int in_ECX;
  char *in_RDX;
  UnicodeString *in_RDI;
  UErrorCode err;
  uconv cvt;
  char *end;
  char *begin;
  UnicodeString *tmp;
  cpcvt_type in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  UErrorCode in_stack_ffffffffffffffc4;
  uconv local_38;
  int local_30;
  char *local_28;
  
  local_28 = in_RDX;
  local_30 = in_ECX;
  uconv::uconv((uconv *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  pUVar1 = uconv::cvt(&local_38);
  icu_70::UnicodeString::UnicodeString
            (in_RDI,local_28,local_30 - (int)local_28,pUVar1,(UErrorCode *)&stack0xffffffffffffffc4)
  ;
  check_and_throw_icu_error(U_ZERO_ERROR);
  uconv::~uconv((uconv *)0x22b705);
  return in_RDI;
}

Assistant:

icu::UnicodeString icu(char_type const *vb,char_type const *ve) const
        {
            char const *begin=reinterpret_cast<char const *>(vb);
            char const *end=reinterpret_cast<char const *>(ve);
            uconv cvt(charset_,cvt_type_);
            UErrorCode err=U_ZERO_ERROR;
            icu::UnicodeString tmp(begin,end-begin,cvt.cvt(),err);
            check_and_throw_icu_error(err);
            return tmp;
        }